

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::String::_opVFormat(String *this,ModifyOp op,char *fmt,__va_list_tag *ap)

{
  Error EVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *__s;
  String *pSVar5;
  long lVar6;
  ulong uVar7;
  size_t size;
  va_list apCopy;
  char buf [1024];
  undefined8 local_458;
  void *pvStack_450;
  void *local_448;
  char local_438 [1032];
  
  uVar4 = (ulong)(byte)*this;
  uVar7 = uVar4;
  if (0x1e < uVar4) {
    uVar7 = *(ulong *)(this + 8);
  }
  lVar6 = 0x1e;
  if (0x1e < uVar4) {
    lVar6 = *(long *)(this + 0x10);
  }
  uVar4 = 0;
  if (op != kAssign) {
    uVar4 = uVar7;
  }
  uVar7 = lVar6 - uVar4;
  local_448 = ap->reg_save_area;
  local_458._0_4_ = ap->gp_offset;
  local_458._4_4_ = ap->fp_offset;
  pvStack_450 = ap->overflow_arg_area;
  if (uVar7 < 0x80) {
    uVar2 = vsnprintf(local_438,0x400,fmt,ap);
    size = (size_t)(int)uVar2;
    if (uVar2 < 0x400) {
      EVar1 = _opString(this,op,local_438,size);
      return EVar1;
    }
  }
  else {
    if ((byte)*this < 0x1f) {
      pSVar5 = this + 1;
    }
    else {
      pSVar5 = *(String **)(this + 0x18);
    }
    uVar2 = vsnprintf((char *)(pSVar5 + uVar4),uVar7,fmt,ap);
    size = (size_t)(int)uVar2;
    if (size <= uVar7) {
      if ((byte)*this < 0x1f) {
        *this = SUB81(uVar4 + size,0);
      }
      else {
        *(ulong *)(this + 8) = uVar4 + size;
      }
      return 0;
    }
  }
  if (-1 < (int)uVar2) {
    __s = prepare(this,op,size);
    if (__s == (char *)0x0) {
      return 1;
    }
    iVar3 = vsnprintf(__s,size + 1,fmt,&local_458);
    if (size == (long)iVar3) {
      return 0;
    }
    _opVFormat();
  }
  return 3;
}

Assistant:

Error String::_opVFormat(ModifyOp op, const char* fmt, va_list ap) noexcept {
  size_t startAt = (op == ModifyOp::kAssign) ? size_t(0) : size();
  size_t remainingCapacity = capacity() - startAt;

  char buf[1024];
  int fmtResult;
  size_t outputSize;

  va_list apCopy;
  va_copy(apCopy, ap);

  if (remainingCapacity >= 128) {
    fmtResult = vsnprintf(data() + startAt, remainingCapacity, fmt, ap);
    outputSize = size_t(fmtResult);

    if (ASMJIT_LIKELY(outputSize <= remainingCapacity)) {
      _setSize(startAt + outputSize);
      return kErrorOk;
    }
  }
  else {
    fmtResult = vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf), fmt, ap);
    outputSize = size_t(fmtResult);

    if (ASMJIT_LIKELY(outputSize < ASMJIT_ARRAY_SIZE(buf)))
      return _opString(op, buf, outputSize);
  }

  if (ASMJIT_UNLIKELY(fmtResult < 0))
    return DebugUtils::errored(kErrorInvalidState);

  char* p = prepare(op, outputSize);
  if (ASMJIT_UNLIKELY(!p))
    return DebugUtils::errored(kErrorOutOfMemory);

  fmtResult = vsnprintf(p, outputSize + 1, fmt, apCopy);
  ASMJIT_ASSERT(size_t(fmtResult) == outputSize);

  return kErrorOk;
}